

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall Catch::clara::detail::BoundFlagRef::setFlag(BoundFlagRef *this,bool flag)

{
  byte in_DL;
  long in_RSI;
  ParserResult *in_RDI;
  ParseResultType *in_stack_ffffffffffffffd8;
  
  **(byte **)(in_RSI + 8) = in_DL & 1;
  BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
            (in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

auto setFlag( bool flag ) -> ParserResult override {
            m_ref = flag;
            return ParserResult::ok( ParseResultType::Matched );
        }